

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O2

void QtMWidgets::drawArrow2(QPainter *p,QRect *r,QColor *color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QPainterPath path;
  QBrush local_48 [8];
  double local_40;
  double local_38;
  
  iVar1 = r->y2;
  iVar2 = r->y1;
  iVar3 = r->x2;
  iVar4 = r->x1;
  QPainterPath::QPainterPath(&path);
  QPainterPath::moveTo(&path,(double)r->x1,(double)r->y1);
  local_40 = (double)(((iVar1 - iVar2) + 1) / 3);
  QPainterPath::lineTo(&path,(double)r->x1,(double)r->y1 + local_40);
  local_38 = (double)(((iVar3 - iVar4) + 1) / 2);
  QPainterPath::lineTo(&path,(double)r->x1 + local_38,(double)(r->y2 + 1));
  QPainterPath::lineTo(&path,(double)(r->x2 + 1),(double)r->y1 + local_40);
  QPainterPath::lineTo(&path,(double)(r->x2 + 1),(double)r->y1);
  QPainterPath::lineTo(&path,local_38 + (double)r->x1,(double)(r->y2 + 1) - local_40);
  QPainterPath::lineTo(&path,(double)r->x1,(double)r->y1);
  QPainter::setPen((QColor *)p);
  QBrush::QBrush(local_48,color,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_48);
  QPainter::drawPath((QPainterPath *)p);
  QPainterPath::~QPainterPath(&path);
  return;
}

Assistant:

void drawArrow2( QPainter * p, const QRect & r,
	const QColor & color )
{
	const qreal width = r.height() / 3;
	const qreal middle = r.width() / 2;

	QPainterPath path;
	path.moveTo( r.x(), r.y() );
	path.lineTo( r.x(), r.y() + width );
	path.lineTo( r.x() + middle, r.y() + r.height() );
	path.lineTo( r.x() + r.width(), r.y() + width );
	path.lineTo( r.x() + r.width(), r.y() );
	path.lineTo( r.x() + middle, r.y() + r.height() - width );
	path.lineTo( r.x(), r.y() );

	p->setPen( color );
	p->setBrush( color );
	p->drawPath( path );
}